

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall
fasttext::FastText::getWordVector(FastText *this,Vector *vec,string *word,int factor,float addWo)

{
  int32_t iVar1;
  int *piVar2;
  int iVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 in_ZMM1 [64];
  vector<int,_std::allocator<int>_> local_40;
  
  Dictionary::getSubwords
            (&local_40,
             (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,word);
  Vector::zero(vec);
  piVar2 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar4 = 0;
    do {
      Vector::addRow(vec,(this->input_).
                         super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar4]);
      uVar4 = uVar4 + 1;
      piVar2 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
  }
  auVar5 = in_ZMM1._0_16_;
  iVar3 = factor;
  if (0 < factor) {
    do {
      Vector::addRow(vec,(this->input_).
                         super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (long)*local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      auVar5 = in_ZMM1._0_16_;
      iVar3 = iVar3 + -1;
      piVar2 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (iVar3 != 0);
  }
  if ((long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish - (long)piVar2 != 0) {
    auVar5 = vcvtusi2sd_avx512f(auVar5,(long)factor +
                                       ((long)local_40.super__Vector_base<int,_std::allocator<int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)piVar2 >> 2));
    Vector::mul(vec,(float)(1.0 / auVar5._0_8_));
  }
  if (0.0 < addWo) {
    iVar1 = Dictionary::getId((this->dict_).
                              super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,word);
    Vector::addRow(vec,(this->output_).
                       super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (long)iVar1,addWo);
  }
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FastText::getWordVector(Vector& vec, const std::string& word, int factor, float addWo) const {
  const std::vector<int32_t>& ngrams = dict_->getSubwords(word);
  vec.zero();
  for (int i = 0; i < ngrams.size(); i++) {
    addInputVector(vec, ngrams[i]);
  }
  for (int i = 0; i < factor; i++) {
    addInputVector(vec,ngrams[0]);//控制subwords中word emb和subword/char emb的加权
  }
  if (ngrams.size() > 0) {
    vec.mul(1.0 / (ngrams.size()+factor));
  }
  if (addWo > 0) {
    const int id = dict_->getId(word);
    vec.addRow(*output_, id, addWo);
  }
}